

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiwrapper.cxx
# Opt level: O2

int MPIABI_Waitall(int count,MPIABI_Request *array_of_requests,MPIABI_Status *array_of_statuses)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  int *piVar10;
  undefined8 *puVar11;
  anon_union_24_2_44bf1552_for_mpi_status *paVar12;
  anon_union_24_2_44bf1552_for_mpi_status *paVar13;
  ulong uVar14;
  
  uVar14 = (ulong)(uint)count;
  if (array_of_statuses != (MPIABI_Status *)0x0) {
    lVar8 = 0;
    uVar9 = 0;
    if (0 < count) {
      uVar9 = uVar14;
    }
    puVar11 = (undefined8 *)((long)&array_of_statuses->mpi_status + 0xc);
    for (; uVar9 * 0x28 - lVar8 != 0; lVar8 = lVar8 + 0x28) {
      uVar1 = *(undefined4 *)((long)&array_of_statuses->mpi_status + lVar8 + 0x14);
      uVar4 = *(undefined8 *)((long)&array_of_statuses->mpi_status + lVar8 + 0xc);
      uVar2 = *(undefined4 *)((long)&array_of_statuses->MPI_ERROR + lVar8);
      *(undefined8 *)((long)puVar11 + -0xc) =
           *(undefined8 *)((long)&array_of_statuses->MPI_SOURCE + lVar8);
      *(undefined4 *)((long)puVar11 + -4) = uVar2;
      *puVar11 = uVar4;
      *(undefined4 *)(puVar11 + 1) = uVar1;
      puVar11 = puVar11 + 3;
    }
  }
  iVar7 = MPI_Waitall(uVar14,array_of_requests,array_of_statuses);
  if (array_of_statuses != (MPIABI_Status *)0x0) {
    piVar10 = &array_of_statuses[uVar14 - 1].MPI_ERROR;
    paVar13 = &array_of_statuses->mpi_status + uVar14;
    while( true ) {
      paVar12 = paVar13 + -1;
      if ((int)uVar14 < 1) break;
      iVar3 = *(int *)((long)paVar13 + -0x10);
      uVar4 = *(undefined8 *)paVar12;
      uVar5 = *(undefined8 *)paVar12;
      uVar6 = *(undefined8 *)((long)paVar13 + -0x10);
      *(undefined8 *)(piVar10 + -4) = *(undefined8 *)((long)paVar13 + -8);
      *(undefined8 *)&((MPIABI_Status *)(piVar10 + -8))->mpi_status = uVar5;
      *(undefined8 *)(piVar10 + -6) = uVar6;
      *(undefined8 *)(piVar10 + -2) = uVar4;
      *piVar10 = iVar3;
      uVar14 = (ulong)((int)uVar14 - 1);
      piVar10 = piVar10 + -10;
      paVar13 = paVar12;
    }
  }
  return iVar7;
}

Assistant:

int MPIABI_Waitall(int count, MPIABI_Request array_of_requests[],
                              MPIABI_Status array_of_statuses[]) {
  const bool ignore_statuses =
      (MPI_Status *)array_of_statuses == MPI_STATUSES_IGNORE;
  MPI_Request *const reqs = (MPI_Request *)(void *)array_of_requests;
  if (sizeof(MPI_Request) != sizeof(MPIABI_Request))
    for (int i = 0; i < count; ++i)
      reqs[i] = (WPI_Request)array_of_requests[i];
  MPI_Status *const stats = (MPI_Status *)(void *)array_of_statuses;
  if (!ignore_statuses)
    for (int i = 0; i < count; ++i)
      stats[i] = (WPI_Status)array_of_statuses[i];
  const int ierr = MPI_Waitall(count, reqs, stats);
  if (sizeof(MPI_Request) != sizeof(MPIABI_Request))
    for (int i = count - 1; i >= 0; --i)
      array_of_requests[i] = (WPI_Request)reqs[i];
  if (!ignore_statuses)
    for (int i = count - 1; i >= 0; --i)
      array_of_statuses[i] = (WPI_Status)stats[i];
  return ierr;
}